

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O2

void start_pass_huff(j_compress_ptr cinfo,boolean gather_statistics)

{
  uint tblno;
  uint tblno_00;
  jpeg_entropy_encoder *pjVar1;
  jpeg_error_mgr *pjVar2;
  int iVar3;
  _func_boolean_j_compress_ptr_JBLOCKROW_ptr *__s;
  _func_void_j_compress_ptr *__s_00;
  code *pcVar4;
  code *pcVar5;
  long lVar6;
  
  pjVar1 = cinfo->entropy;
  pcVar4 = encode_mcu_gather;
  if (gather_statistics == 0) {
    pcVar4 = encode_mcu_huff;
  }
  pcVar5 = finish_pass_gather;
  if (gather_statistics == 0) {
    pcVar5 = finish_pass_huff;
  }
  pjVar1->encode_mcu = pcVar4;
  pjVar1->finish_pass = pcVar5;
  iVar3 = jsimd_can_huff_encode_one_block();
  *(int *)&pjVar1[8].start_pass = iVar3;
  for (lVar6 = 0; lVar6 < cinfo->comps_in_scan; lVar6 = lVar6 + 1) {
    tblno = cinfo->cur_comp_info[lVar6]->dc_tbl_no;
    tblno_00 = cinfo->cur_comp_info[lVar6]->ac_tbl_no;
    if (gather_statistics == 0) {
      jpeg_make_c_derived_tbl(cinfo,1,tblno,(c_derived_tbl **)(&pjVar1[2].finish_pass + (int)tblno))
      ;
      jpeg_make_c_derived_tbl
                (cinfo,0,tblno_00,(c_derived_tbl **)(&pjVar1[4].start_pass + (int)tblno_00));
    }
    else {
      if (3 < tblno) {
        pjVar2 = cinfo->err;
        pjVar2->msg_code = 0x32;
        (pjVar2->msg_parm).i[0] = tblno;
        (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      }
      if (3 < tblno_00) {
        pjVar2 = cinfo->err;
        pjVar2->msg_code = 0x32;
        (pjVar2->msg_parm).i[0] = tblno_00;
        (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      }
      __s = (&pjVar1[5].encode_mcu)[(int)tblno];
      if (__s == (_func_boolean_j_compress_ptr_JBLOCKROW_ptr *)0x0) {
        __s = (_func_boolean_j_compress_ptr_JBLOCKROW_ptr *)
              (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x808);
        (&pjVar1[5].encode_mcu)[(int)tblno] = __s;
      }
      memset(__s,0,0x808);
      __s_00 = (&pjVar1[6].finish_pass)[(int)tblno_00];
      if (__s_00 == (_func_void_j_compress_ptr *)0x0) {
        __s_00 = (_func_void_j_compress_ptr *)
                 (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x808);
        (&pjVar1[6].finish_pass)[(int)tblno_00] = __s_00;
      }
      memset(__s_00,0,0x808);
    }
    *(undefined4 *)((long)&pjVar1[1].encode_mcu + lVar6 * 4 + 4) = 0;
  }
  pjVar1[1].start_pass = (_func_void_j_compress_ptr_boolean *)0x0;
  *(undefined4 *)&pjVar1[1].encode_mcu = 0x40;
  *(uint *)&pjVar1[2].encode_mcu = cinfo->restart_interval;
  *(undefined4 *)((long)&pjVar1[2].encode_mcu + 4) = 0;
  return;
}

Assistant:

METHODDEF(void)
start_pass_huff(j_compress_ptr cinfo, boolean gather_statistics)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr)cinfo->entropy;
  int ci, dctbl, actbl;
  jpeg_component_info *compptr;

  if (gather_statistics) {
#ifdef ENTROPY_OPT_SUPPORTED
    entropy->pub.encode_mcu = encode_mcu_gather;
    entropy->pub.finish_pass = finish_pass_gather;
#else
    ERREXIT(cinfo, JERR_NOT_COMPILED);
#endif
  } else {
    entropy->pub.encode_mcu = encode_mcu_huff;
    entropy->pub.finish_pass = finish_pass_huff;
  }

  entropy->simd = jsimd_can_huff_encode_one_block();

  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    dctbl = compptr->dc_tbl_no;
    actbl = compptr->ac_tbl_no;
    if (gather_statistics) {
#ifdef ENTROPY_OPT_SUPPORTED
      /* Check for invalid table indexes */
      /* (make_c_derived_tbl does this in the other path) */
      if (dctbl < 0 || dctbl >= NUM_HUFF_TBLS)
        ERREXIT1(cinfo, JERR_NO_HUFF_TABLE, dctbl);
      if (actbl < 0 || actbl >= NUM_HUFF_TBLS)
        ERREXIT1(cinfo, JERR_NO_HUFF_TABLE, actbl);
      /* Allocate and zero the statistics tables */
      /* Note that jpeg_gen_optimal_table expects 257 entries in each table! */
      if (entropy->dc_count_ptrs[dctbl] == NULL)
        entropy->dc_count_ptrs[dctbl] = (long *)
          (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                      257 * sizeof(long));
      MEMZERO(entropy->dc_count_ptrs[dctbl], 257 * sizeof(long));
      if (entropy->ac_count_ptrs[actbl] == NULL)
        entropy->ac_count_ptrs[actbl] = (long *)
          (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                      257 * sizeof(long));
      MEMZERO(entropy->ac_count_ptrs[actbl], 257 * sizeof(long));
#endif
    } else {
      /* Compute derived values for Huffman tables */
      /* We may do this more than once for a table, but it's not expensive */
      jpeg_make_c_derived_tbl(cinfo, TRUE, dctbl,
                              &entropy->dc_derived_tbls[dctbl]);
      jpeg_make_c_derived_tbl(cinfo, FALSE, actbl,
                              &entropy->ac_derived_tbls[actbl]);
    }
    /* Initialize DC predictions to 0 */
    entropy->saved.last_dc_val[ci] = 0;
  }

  /* Initialize bit buffer to empty */
  if (entropy->simd) {
    entropy->saved.put_buffer.simd = 0;
#if defined(__aarch64__) && !defined(NEON_INTRINSICS)
    entropy->saved.free_bits = 0;
#else
    entropy->saved.free_bits = SIMD_BIT_BUF_SIZE;
#endif
  } else {
    entropy->saved.put_buffer.c = 0;
    entropy->saved.free_bits = BIT_BUF_SIZE;
  }

  /* Initialize restart stuff */
  entropy->restarts_to_go = cinfo->restart_interval;
  entropy->next_restart_num = 0;
}